

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool cmsys::SystemTools::Touch(string *filename,bool create)

{
  int iVar1;
  FILE *__stream;
  bool bVar2;
  stat st;
  stat local_a0;
  
  if ((filename->_M_string_length != 0) &&
     (iVar1 = lstat((filename->_M_dataplus)._M_p,&local_a0), iVar1 == 0)) {
    iVar1 = utimensat(-100,(filename->_M_dataplus)._M_p,(timespec *)0x0,0);
    return -1 < iVar1;
  }
  bVar2 = true;
  if (create) {
    __stream = fopen((filename->_M_dataplus)._M_p,"a+b");
    bVar2 = __stream != (FILE *)0x0;
    if (bVar2) {
      fclose(__stream);
      bVar2 = true;
    }
  }
  return bVar2;
}

Assistant:

bool SystemTools::Touch(const std::string& filename, bool create)
{
  if (!SystemTools::PathExists(filename)) {
    if (create) {
      FILE* file = Fopen(filename, "a+b");
      if (file) {
        fclose(file);
        return true;
      }
      return false;
    } else {
      return true;
    }
  }
#if defined(_WIN32) && !defined(__CYGWIN__)
  HANDLE h = CreateFileW(Encoding::ToWindowsExtendedPath(filename).c_str(),
                         FILE_WRITE_ATTRIBUTES, FILE_SHARE_WRITE, 0,
                         OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0);
  if (!h) {
    return false;
  }
  FILETIME mtime;
  GetSystemTimeAsFileTime(&mtime);
  if (!SetFileTime(h, 0, 0, &mtime)) {
    CloseHandle(h);
    return false;
  }
  CloseHandle(h);
#elif KWSYS_CXX_HAS_UTIMENSAT
  // utimensat is only available on newer Unixes and macOS 10.13+
  if (utimensat(AT_FDCWD, filename.c_str(), NULL, 0) < 0) {
    return false;
  }
#else
  // fall back to utimes
  if (utimes(filename.c_str(), NULL) < 0) {
    return false;
  }
#endif
  return true;
}